

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleSignal.h
# Opt level: O1

CollectorResult __thiscall
Simple::Lib::ProtoSignal<bool_(),_Simple::CollectorWhile0<bool>_>::emit
          (ProtoSignal<bool_(),_Simple::CollectorWhile0<bool>_> *this)

{
  int iVar1;
  bool bVar2;
  SignalLink *this_00;
  SignalLink *this_01;
  
  this_01 = this->callback_ring_;
  if (this_01 == (SignalLink *)0x0) {
    bVar2 = false;
  }
  else {
    iVar1 = this_01->ref_count;
    this_01->ref_count = iVar1 + 1;
    if (iVar1 < 0) {
LAB_00109ac5:
      __assert_fail("ref_count > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/billyquith[P]SimpleSignal/SimpleSignal.h"
                    ,0x51,
                    "void Simple::Lib::ProtoSignal<bool (), Simple::CollectorWhile0<bool>>::SignalLink::incref()"
                   );
    }
    bVar2 = false;
    do {
      if ((this_01->function).super__Function_base._M_manager != (_Manager_type)0x0) {
        bVar2 = (*(this_01->function)._M_invoker)((_Any_data *)&this_01->function);
        this_00 = this_01;
        if (bVar2) break;
      }
      this_00 = this_01->next;
      iVar1 = this_00->ref_count;
      this_00->ref_count = iVar1 + 1;
      if (iVar1 < 0) goto LAB_00109ac5;
      SignalLink::decref(this_01);
      this_01 = this_00;
    } while (this_00 != this->callback_ring_);
    SignalLink::decref(this_00);
  }
  return bVar2;
}

Assistant:

CollectorResult
  emit (Args... args)
  {
    Collector collector;
    if (!callback_ring_)
      return collector.result();
    SignalLink *link = callback_ring_;
    link->incref();
    do
      {
        if (link->function != nullptr)
          {
            const bool continue_emission = this->invoke (collector, link->function, args...);
            if (!continue_emission)
              break;
          }
        SignalLink *old = link;
        link = old->next;
        link->incref();
        old->decref();
      }
    while (link != callback_ring_);
    link->decref();
    return collector.result();
  }